

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osQueue.cpp
# Opt level: O1

void osQueue::dump_info(ostream *out)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  
  osMutex::Take(&QueueListLock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osQueue.cpp"
                ,0xaa);
  lVar4 = 0;
  do {
    lVar1 = *(long *)((long)QueueList + lVar4);
    if (lVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"Queue ",6);
      __s = *(char **)(lVar1 + 8);
      if (__s == (char *)0x0) {
        std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out," is size ",9);
      std::ostream::operator<<(out,*(int *)(lVar1 + 0x18));
      std::__ostream_insert<char,std::char_traits<char>>(out," and contains ",0xe);
      poVar3 = (ostream *)std::ostream::operator<<(out,*(int *)(lVar1 + 0x1c));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," objects\n",9);
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xa0);
  osMutex::Give(&QueueListLock);
  return;
}

Assistant:

void osQueue::dump_info(std::ostream& out)
{
    QueueListLock.Take(__FILE__, __LINE__);
    for (size_t i = 0; i < MAX_QUEUE_COUNT; i++)
    {
        osQueue* queue = QueueList[i];
        if (queue != nullptr)
        {
            out << "Queue " << queue->GetName();
            out << " is size " << queue->MaxElements;
            out << " and contains " << queue->GetCount() << " objects\n";
            // This is hanging
            // can't lock the queue and tx tcp frames as it can deadlock
            // tx tcp locks queues
            // might be a better way to do this
            //         queue->Lock.Take( __FILE__, __LINE__ );
            //         int      index = queue->NextOutIndex;
            //         for( int j = 0; j<queue->GetCount(); j++ )
            //         {
            //            pfunc->Printf( "   Object at 0x%08X\n", queue->Array[ index ] );
            //            index = queue->Increment( index );
            //         }
            //         queue->Lock.Give();
        }
    }

    QueueListLock.Give();
}